

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 262intf.c
# Opt level: O2

UINT8 device_start_ymf262_adlibemu(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT8 UVar1;
  DEV_DATA DVar2;
  uint samplerate;
  
  samplerate = cfg->clock / 0x120;
  if (cfg->srMode == '\x02') {
    if (samplerate <= cfg->smplRate) {
      samplerate = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    samplerate = cfg->smplRate;
  }
  DVar2.chipInf = adlib_OPL3_init(cfg->clock,samplerate);
  if (DVar2.chipInf == (void *)0x0) {
    UVar1 = 0xff;
  }
  else {
    *(void **)DVar2.chipInf = DVar2.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = samplerate;
    retDevInf->devDef = &devDef262_AdLibEmu;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_ymf262_adlibemu(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 288;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = adlib_OPL3_init(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef262_AdLibEmu);
	return 0x00;
}